

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O0

int Abc_ZddCountNodesArray(Abc_ZddMan *p,Vec_Int_t *vNodes)

{
  int iVar1;
  undefined4 local_24;
  int Count;
  int Id;
  int i;
  Vec_Int_t *vNodes_local;
  Abc_ZddMan *p_local;
  
  local_24 = 0;
  for (Count = 0; iVar1 = Vec_IntSize(vNodes), Count < iVar1; Count = Count + 1) {
    iVar1 = Vec_IntEntry(vNodes,Count);
    iVar1 = Abc_ZddCount_rec(p,iVar1);
    local_24 = iVar1 + local_24;
  }
  for (Count = 0; iVar1 = Vec_IntSize(vNodes), Count < iVar1; Count = Count + 1) {
    iVar1 = Vec_IntEntry(vNodes,Count);
    Abc_ZddUnmark_rec(p,iVar1);
  }
  return local_24;
}

Assistant:

int Abc_ZddCountNodesArray( Abc_ZddMan * p, Vec_Int_t * vNodes )
{
    int i, Id, Count = 0;
    Vec_IntForEachEntry( vNodes, Id, i )
        Count += Abc_ZddCount_rec( p, Id );
    Vec_IntForEachEntry( vNodes, Id, i )
        Abc_ZddUnmark_rec( p, Id );
    return Count;
}